

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffm_score.cc
# Opt level: O2

real_t __thiscall
xLearn::FFMScore::CalcScore(FFMScore *this,SparseRow *row,Model *model,real_t norm)

{
  float *pfVar1;
  float *pfVar2;
  uint uVar3;
  uint uVar4;
  pointer pNVar5;
  float fVar6;
  int iVar7;
  index_t d;
  ulong uVar8;
  pointer pNVar9;
  int iVar10;
  uint uVar11;
  pointer pNVar12;
  pointer pNVar13;
  undefined1 auVar14 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar15 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar18 [64];
  undefined1 extraout_var [60];
  
  auVar17 = in_ZMM2._0_16_;
  auVar15 = in_ZMM1._0_16_;
  auVar18._4_60_ = in_register_00001204;
  auVar18._0_4_ = norm;
  if (norm < 0.0) {
    auVar16._0_4_ = sqrtf(norm);
    auVar16._4_60_ = extraout_var;
    auVar14 = auVar16._0_16_;
  }
  else {
    auVar14 = vsqrtss_avx(auVar18._0_16_,auVar18._0_16_);
  }
  auVar18 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar15 = vcvtusi2ss_avx512f(auVar15,model->aux_size_);
  pNVar9 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = model->num_feat_;
  uVar4 = model->num_field_;
  pNVar5 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  iVar7 = vcvttss2usi_avx512f(auVar15);
  for (pNVar12 = pNVar9; pNVar12 != pNVar5; pNVar12 = pNVar12 + 1) {
    if (pNVar12->feat_id < uVar3) {
      auVar15 = vfmadd231ss_fma(auVar18._0_16_,auVar14,
                                ZEXT416((uint)(pNVar12->feat_val *
                                              model->param_w_[pNVar12->feat_id * iVar7])));
      auVar18 = ZEXT1664(auVar15);
    }
  }
  auVar15 = vcvtusi2ss_avx512f(auVar17,model->num_K_);
  auVar15 = ZEXT416((uint)(auVar15._0_4_ * 0.25));
  auVar15 = vroundss_avx(auVar15,auVar15,10);
  iVar10 = vcvttss2usi_avx512f(auVar15);
  auVar16 = ZEXT864(0) << 0x20;
  uVar11 = iVar10 * iVar7 * 4;
  for (; pNVar9 != pNVar5; pNVar9 = pNVar9 + 1) {
    if (pNVar9->field_id < uVar4 && pNVar9->feat_id < uVar3) {
      pNVar12 = pNVar9;
      while (pNVar13 = pNVar12, pNVar12 = pNVar13 + 1, pNVar12 != pNVar5) {
        if (pNVar13[1].field_id < uVar4 && pNVar13[1].feat_id < uVar3) {
          fVar6 = pNVar9->feat_val * pNVar13[1].feat_val * norm;
          for (uVar8 = 0; (uint)uVar8 < uVar11; uVar8 = (ulong)((uint)uVar8 + iVar7 * 4)) {
            pfVar1 = model->param_v_ +
                     (ulong)(pNVar9->feat_id * uVar11 * uVar4) +
                     pNVar13[1].field_id * uVar11 + uVar8;
            pfVar2 = model->param_v_ +
                     (ulong)(pNVar9->field_id * uVar11) +
                     pNVar13[1].feat_id * uVar11 * uVar4 + uVar8;
            auVar16 = ZEXT1664(CONCAT412(auVar16._12_4_ + fVar6 * pfVar1[3] * pfVar2[3],
                                         CONCAT48(auVar16._8_4_ + fVar6 * pfVar1[2] * pfVar2[2],
                                                  CONCAT44(auVar16._4_4_ +
                                                           fVar6 * pfVar1[1] * pfVar2[1],
                                                           auVar16._0_4_ + fVar6 * *pfVar1 * *pfVar2
                                                          ))));
          }
        }
      }
    }
  }
  auVar15 = vhaddps_avx(auVar16._0_16_,auVar16._0_16_);
  auVar15 = vhaddps_avx(auVar15,auVar15);
  return auVar18._0_4_ + *model->param_b_ + auVar15._0_4_;
}

Assistant:

real_t FFMScore::CalcScore(const SparseRow* row,
                           Model& model,
                           real_t norm) {
  /*********************************************************
   *  linear term and bias term                            *
   *********************************************************/
  real_t sum_w = 0;
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  index_t num_field = model.GetNumField();
  index_t aux_size = model.GetAuxiliarySize();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    sum_w += (iter->feat_val * w[feat_id*aux_size] * sqrt_norm);
  }
  // bias
  w = model.GetParameter_b();
  sum_w += w[0];
  /*********************************************************
   *  latent factor                                        *
   *********************************************************/
  index_t align0 = aux_size * model.get_aligned_k();
  index_t align1 = num_field * align0;
  int align = kAlign * aux_size;
  w = model.GetParameter_v();
  __m128 XMMt = _mm_setzero_ps();
  for (SparseRow::const_iterator iter_i = row->begin();
       iter_i != row->end(); ++iter_i) {
    index_t j1 = iter_i->feat_id;
    index_t f1 = iter_i->field_id;
    // To avoid unseen feature in Prediction
    if (j1 >= num_feat || f1 >= num_field) continue;
    real_t v1 = iter_i->feat_val;
    for (SparseRow::const_iterator iter_j = iter_i+1;
         iter_j != row->end(); ++iter_j) {
      index_t j2 = iter_j->feat_id;
      index_t f2 = iter_j->field_id;
      // To avoid unseen feature in Prediction
      if (j2 >= num_feat || f2 >= num_field) continue;
      real_t v2 = iter_j->feat_val;
      real_t* w1_base = w + j1*align1 + f2*align0;
      real_t* w2_base = w + j2*align1 + f1*align0;
      __m128 XMMv = _mm_set1_ps(v1*v2*norm);
      for (index_t d = 0; d < align0; d += align) {
        __m128 XMMw1 = _mm_load_ps(w1_base + d);
        __m128 XMMw2 = _mm_load_ps(w2_base + d);
        XMMt = _mm_add_ps(XMMt,
               _mm_mul_ps(
               _mm_mul_ps(XMMw1, XMMw2), XMMv));
      }
    }
  }
  real_t sum_v = 0;
  XMMt = _mm_hadd_ps(XMMt, XMMt);
  XMMt = _mm_hadd_ps(XMMt, XMMt);
  _mm_store_ss(&sum_v, XMMt);

  return sum_v + sum_w;
}